

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_photogrammetry.cpp
# Opt level: O0

void __thiscall ON_AerialPhotoImageFrustum::Unset(ON_AerialPhotoImageFrustum *this)

{
  ON_AerialPhotoImageFrustum *this_local;
  
  this->m_height = -1.23432101234321e+308;
  this->m_corners[0].x = ON_2dPoint::UnsetPoint.x;
  this->m_corners[0].y = ON_2dPoint::UnsetPoint.y;
  this->m_corners[1].x = ON_2dPoint::UnsetPoint.x;
  this->m_corners[1].y = ON_2dPoint::UnsetPoint.y;
  this->m_corners[2].x = ON_2dPoint::UnsetPoint.x;
  this->m_corners[2].y = ON_2dPoint::UnsetPoint.y;
  this->m_corners[3].x = ON_2dPoint::UnsetPoint.x;
  this->m_corners[3].y = ON_2dPoint::UnsetPoint.y;
  ON_UnitSystem::operator=(&this->m_unit_system,&ON_UnitSystem::None);
  return;
}

Assistant:

void ON_AerialPhotoImageFrustum::Unset()
{
  m_height = ON_UNSET_VALUE;
  m_corners[0] = ON_2dPoint::UnsetPoint;
  m_corners[1] = ON_2dPoint::UnsetPoint;
  m_corners[2] = ON_2dPoint::UnsetPoint;
  m_corners[3] = ON_2dPoint::UnsetPoint;
  m_unit_system = ON_UnitSystem::None;
}